

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNotBackUTF8(UnicodeSetStringSpan *this,uint8_t *s,int32_t length)

{
  byte bVar1;
  uint uVar2;
  uint8_t *puVar3;
  UBool UVar4;
  int32_t iVar5;
  UChar32 c;
  uint8_t *puVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int local_44;
  UnicodeSet *local_40;
  uint8_t *local_38;
  
  uVar2 = this->strings->count;
  lVar8 = 0;
  if (this->all != '\0') {
    lVar8 = (long)(int)uVar2 * 3;
  }
  puVar3 = this->spanLengths;
  local_40 = &this->spanSet;
  do {
    iVar5 = UnicodeSet::spanBackUTF8(this->pSpanNotSet,(char *)s,length,USET_SPAN_NOT_CONTAINED);
    if (iVar5 == 0) {
      return 0;
    }
    bVar1 = s[(long)iVar5 + -1];
    if ((char)bVar1 < '\0') {
      local_44 = iVar5 + -1;
      c = utf8_prevCharSafeBody_63(s,0,&local_44,(uint)bVar1,-3);
      iVar11 = iVar5 - local_44;
      local_38 = s;
      UVar4 = UnicodeSet::contains(local_40,c);
      iVar7 = -iVar11;
      if (UVar4 != '\0') {
        iVar7 = iVar11;
      }
      s = local_38;
      if (0 < iVar7) {
        return iVar5;
      }
    }
    else {
      UVar4 = UnicodeSet::contains(local_40,(uint)bVar1);
      iVar7 = -1;
      if (UVar4 != '\0') {
        return iVar5;
      }
    }
    if (0 < (int)uVar2) {
      puVar6 = this->utf8;
      uVar9 = 0;
      do {
        iVar11 = this->utf8Lengths[uVar9];
        lVar10 = (long)iVar11;
        if (((lVar10 != 0) && (iVar11 <= iVar5)) && (puVar3[uVar9 + lVar8] != 0xff)) {
          iVar11 = iVar11 + 1;
          lVar12 = 0;
          while (s[lVar12 + (iVar5 - lVar10)] == puVar6[lVar12]) {
            lVar12 = lVar12 + 1;
            iVar11 = iVar11 + -1;
            if (iVar11 < 2) {
              return iVar5;
            }
          }
        }
        puVar6 = puVar6 + lVar10;
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar2);
    }
    length = iVar7 + iVar5;
  } while (length != 0);
  return 0;
}

Assistant:

int32_t UnicodeSetStringSpan::spanNotBackUTF8(const uint8_t *s, int32_t length) const {
    int32_t pos=length;
    int32_t i, stringsLength=strings.size();
    uint8_t *spanBackUTF8Lengths=spanLengths;
    if(all) {
        spanBackUTF8Lengths+=3*stringsLength;
    }
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        pos=pSpanNotSet->spanBackUTF8((const char *)s, pos, USET_SPAN_NOT_CONTAINED);
        if(pos==0) {
            return 0;  // Reached the start of the string.
        }

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOneBackUTF8(spanSet, s, pos);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        const uint8_t *s8=utf8;
        int32_t length8;
        for(i=0; i<stringsLength; ++i) {
            length8=utf8Lengths[i];
            // ALL_CP_CONTAINED: Irrelevant string.
            if(length8!=0 && spanBackUTF8Lengths[i]!=ALL_CP_CONTAINED && length8<=pos && matches8(s+pos-length8, s8, length8)) {
                return pos;  // There is a set element at pos.
            }
            s8+=length8;
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos+=cpLength;
    } while(pos!=0);
    return 0;  // Reached the start of the string.
}